

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

Box2i __thiscall
Imf_3_2::DeepTiledOutputFile::dataWindowForTile
          (DeepTiledOutputFile *this,int dx,int dy,int lx,int ly)

{
  Data *pDVar1;
  bool bVar2;
  ArgExc *this_00;
  undefined4 in_register_00000034;
  int in_R9D;
  Box2i BVar3;
  stringstream _iex_replace_s;
  
  bVar2 = isValidTile((DeepTiledOutputFile *)CONCAT44(in_register_00000034,dx),dy,lx,ly,in_R9D);
  if (bVar2) {
    pDVar1 = ((DeepTiledOutputFile *)CONCAT44(in_register_00000034,dx))->_data;
    BVar3 = Imf_3_2::dataWindowForTile
                      ((Imf_3_2 *)this,&pDVar1->tileDesc,pDVar1->minX,pDVar1->maxX,pDVar1->minY,
                       pDVar1->maxY,dy,lx,ly,in_R9D);
    BVar3.min = (Vec2<int>)this;
    return BVar3;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,"Arguments not in valid range.");
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

Box2i
DeepTiledOutputFile::dataWindowForTile (int dx, int dy, int lx, int ly) const
{
    try
    {
        if (!isValidTile (dx, dy, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Arguments not in valid range.");

        return OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
            _data->tileDesc,
            _data->minX,
            _data->maxX,
            _data->minY,
            _data->maxY,
            dx,
            dy,
            lx,
            ly);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling dataWindowForTile() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}